

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

NDeviceChannel * __thiscall
MlmWrap::findTrodesChannel
          (NDeviceChannel *__return_storage_ptr__,MlmWrap *this,NDevice *device,string *ch)

{
  pointer pNVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
  __it;
  __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
  _Var5;
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> channelsvec;
  long *local_c8;
  undefined8 local_c0;
  long local_b8;
  undefined8 uStack_b0;
  long *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  uint7 uStack_97;
  undefined8 uStack_90;
  long *local_88;
  undefined8 local_80;
  long local_78;
  undefined8 uStack_70;
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> local_68;
  string local_50 [32];
  
  NDevice::getChannels(&local_68,device);
  pNVar1 = local_68.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::string(local_50,(string *)ch);
  std::__cxx11::string::string((string *)&local_a8,local_50);
  local_80 = local_a0;
  local_c8 = &local_b8;
  if (local_a8 == (long *)&local_98) {
    uStack_b0 = uStack_90;
    local_a8 = local_c8;
  }
  local_a0 = 0;
  local_98 = 0;
  local_88 = local_a8;
  if (local_a8 == local_c8) {
    uStack_70 = uStack_b0;
    local_88 = &local_78;
  }
  local_c0 = 0;
  local_b8 = (ulong)uStack_97 << 8;
  local_a8 = (long *)&local_98;
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string((string *)&local_c8,(string *)&local_88);
  lVar4 = (long)pNVar1 -
          (long)local_68.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl
                .super__Vector_impl_data._M_start;
  __it._M_current =
       local_68.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (lVar3 = lVar4 >> 8; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
            operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                        *)&local_c8,__it);
    _Var5._M_current = __it._M_current;
    if (bVar2) goto LAB_001965bc;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
            operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                        *)&local_c8,__it._M_current + 1);
    _Var5._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_001965bc;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
            operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                        *)&local_c8,__it._M_current + 2);
    _Var5._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_001965bc;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
            operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                        *)&local_c8,__it._M_current + 3);
    _Var5._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_001965bc;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x100;
  }
  lVar4 = lVar4 >> 6;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var5._M_current = pNVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
                  operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                              *)&local_c8,__it), _Var5._M_current = __it._M_current, bVar2))
      goto LAB_001965bc;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
            operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                        *)&local_c8,__it);
    _Var5._M_current = __it._M_current;
    if (bVar2) goto LAB_001965bc;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
          operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                      *)&local_c8,__it);
  _Var5._M_current = pNVar1;
  if (bVar2) {
    _Var5._M_current = __it._M_current;
  }
LAB_001965bc:
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string(local_50);
  if (_Var5._M_current ==
      local_68.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    NDeviceChannel::NDeviceChannel(__return_storage_ptr__);
  }
  else {
    NDeviceChannel::NDeviceChannel(__return_storage_ptr__,_Var5._M_current);
  }
  std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::~vector(&local_68);
  return __return_storage_ptr__;
}

Assistant:

NDeviceChannel MlmWrap::findTrodesChannel(const NDevice& device, std::string ch){
    //Finding channel
//    NDevice* device = *deviceit;
    auto channelsvec = device.getChannels();
    auto channelit = std::find_if(channelsvec.begin(), channelsvec.end(),
                                  [ch](NDeviceChannel cha){return cha.getId() == ch;});
    if(channelit == channelsvec.end()){
        return NDeviceChannel();
    }
    return *channelit;
}